

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::verifyCore(Federate *this)

{
  uint uVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string message;
  char *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa8;
  undefined1 local_28 [40];
  
  peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x21af7c);
  uVar1 = (*peVar2->_vptr_Core[7])();
  if ((uVar1 & 1) == 0) {
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21af9b);
    (*peVar2->_vptr_Core[6])();
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x21afb2);
    uVar1 = (*peVar2->_vptr_Core[7])();
    if ((uVar1 & 1) == 0) {
      peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21afd1);
      uVar1 = (*peVar2->_vptr_Core[9])();
      if ((uVar1 & 1) != 0) {
        peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x21aff6);
        (*peVar2->_vptr_Core[0x11])(local_28);
        peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x21b014);
        (*peVar2->_vptr_Core[8])();
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x28);
        std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
        RegistrationFailure::RegistrationFailure
                  ((RegistrationFailure *)in_RDI,in_stack_ffffffffffffffa8);
        __cxa_throw(this_00,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure
                   );
      }
      peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21b09e);
      (*peVar2->_vptr_Core[8])();
      uVar3 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,in_stack_ffffffffffffff98);
      RegistrationFailure::RegistrationFailure
                ((RegistrationFailure *)in_RDI,in_stack_ffffffffffffffa8);
      __cxa_throw(uVar3,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
    }
  }
  return;
}

Assistant:

void Federate::verifyCore()
{
    /** make sure the core is connected */
    if (!coreObject->isConnected()) {
        coreObject->connect();
        if (!coreObject->isConnected()) {
            if (coreObject->hasError()) {
                auto message = coreObject->getErrorMessage();
                coreObject->disconnect();
                throw(RegistrationFailure(message));
            }
            coreObject->disconnect();
            throw(RegistrationFailure("Unable to connect to broker->unable to register federate"));
        }
    }
}